

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O2

ktx_error_code_e
ktxTexture_VkUploadEx_WithSuballocator
          (ktxTexture *This,ktxVulkanDeviceInfo *vdi,ktxVulkanTexture *vkTexture,
          VkImageTiling tiling,VkImageUsageFlags usageFlags,VkImageLayout finalLayout,
          ktxVulkanTexture_subAllocatorCallbacks *subAllocatorCallbacks)

{
  VkImage *ppVVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ktx_bool_t kVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  VkCommandBuffer pVVar7;
  ktx_uint8_t *__src;
  undefined4 uVar9;
  ktxVulkanFunctions vkFuncs;
  ktxVulkanFunctions vkFuncs_00;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ktx_bool_t kVar12;
  ktx_uint32_t kVar13;
  VkFormat VVar14;
  VkResult VVar15;
  uint32_t uVar16;
  ktx_error_code_e kVar17;
  uint64_t uVar18;
  VkBufferImageCopy *pVVar19;
  VkImage pVVar20;
  VkFormatProperties *pVVar21;
  long lVar22;
  uint32_t uVar23;
  VkImageViewType VVar24;
  code *iterCb;
  ktxVulkanFunctions *pkVar25;
  uint uVar26;
  undefined8 *puVar27;
  ktx_uint32_t kVar28;
  VkCommandBuffer *ppVVar29;
  bool bVar30;
  byte bVar31;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar32 [16];
  undefined4 uVar33;
  VkImageFormatProperties *pVVar34;
  undefined4 uVar35;
  undefined8 in_stack_fffffffffffffb80;
  undefined8 uVar36;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 uVar37;
  undefined4 in_stack_fffffffffffffb8c;
  undefined8 in_stack_fffffffffffffb90;
  VkImageMemoryBarrier *pVVar38;
  undefined1 in_stack_fffffffffffffb98 [208];
  VkImageType local_360;
  VkFilter local_358;
  VkDeviceMemory stagingMemory;
  VkImageUsageFlags local_340;
  VkImageCreateFlags local_33c;
  VkCommandBuffer *local_338;
  VkBuffer stagingBuffer;
  VkMemoryAllocateInfo memAllocInfo;
  VkImageSubresourceRange subresourceRange_1;
  VkMemoryRequirements memReqs;
  VkDeviceMemory mappableMemory;
  void *pvStack_2d0;
  undefined8 local_2c8;
  uint64_t local_2c0;
  ulong local_2b8;
  ktxVulkanFunctions *local_2b0;
  VkImage mappableImage;
  undefined8 local_2a0;
  undefined8 local_298;
  ktx_uint8_t *local_290;
  ktx_uint32_t local_288;
  ktx_uint32_t local_284;
  ktx_uint8_t *pMappedStagingBuffer;
  uint64_t numPages;
  void *pvStack_270;
  undefined8 local_268;
  VkDeviceSize VStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  uint32_t *local_248;
  VkBufferImageCopy *local_240;
  VkSubmitInfo submitInfo;
  VkFence copyFence;
  VkImageCreateInfo local_1e8;
  VkCommandBufferBeginInfo cmdBufBeginInfo;
  VkImageFormatProperties imageFormatProperties;
  VkFormatProperties formatProperties;
  void *local_48;
  ktxTexture *local_40;
  
  bVar31 = 0;
  cmdBufBeginInfo.flags = 0;
  cmdBufBeginInfo._20_4_ = 0;
  cmdBufBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufBeginInfo._4_4_ = 0;
  cmdBufBeginInfo.pNext = (void *)0x0;
  local_1e8.pNext = (void *)0x0;
  local_1e8.queueFamilyIndexCount = 0;
  local_1e8._68_4_ = 0;
  local_1e8.pQueueFamilyIndices = (uint32_t *)0x0;
  local_1e8.samples = 0;
  local_1e8.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_1e8.usage = 0;
  local_1e8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_1e8.extent.height = 0;
  local_1e8.extent.depth = 0;
  local_1e8.mipLevels = 0;
  local_1e8.arrayLayers = 0;
  local_1e8.flags = 0;
  local_1e8.imageType = VK_IMAGE_TYPE_1D;
  local_1e8.format = VK_FORMAT_UNDEFINED;
  local_1e8.extent.width = 0;
  local_1e8._80_8_ = 0;
  local_1e8.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_1e8._4_4_ = 0;
  memAllocInfo.allocationSize = 0;
  memAllocInfo.memoryTypeIndex = 0;
  memAllocInfo._28_4_ = 0;
  memAllocInfo.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  memAllocInfo._4_4_ = 0;
  memAllocInfo.pNext = (void *)0x0;
  kVar13 = ktxTexture_GetElementSize(This);
  if (subAllocatorCallbacks != (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
    if (subAllocatorCallbacks->allocMemFuncPtr == (ktxVulkanTexture_subAllocatorAllocMemFuncPtr)0x0)
    {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->bindBufferFuncPtr ==
        (ktxVulkanTexture_subAllocatorBindBufferFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->bindImageFuncPtr ==
        (ktxVulkanTexture_subAllocatorBindImageFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->memoryMapFuncPtr ==
        (ktxVulkanTexture_subAllocatorMemoryMapFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->memoryUnmapFuncPtr ==
        (ktxVulkanTexture_subAllocatorMemoryUnmapFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->freeMemFuncPtr == (ktxVulkanTexture_subAllocatorFreeMemFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
  }
  if (vkTexture == (ktxVulkanTexture *)0x0 ||
      (This == (ktxTexture *)0x0 || vdi == (ktxVulkanDeviceInfo *)0x0)) {
    return KTX_INVALID_VALUE;
  }
  if ((This->pData == (ktx_uint8_t *)0x0) && (kVar12 = ktxTexture_isActiveStream(This), !kVar12)) {
    return KTX_INVALID_OPERATION;
  }
  kVar28 = This->numDimensions;
  if (This->numFaces == 6) {
    if (kVar28 != 2) {
      __assert_fail("This->numFaces == 6 ? This->numDimensions == 2 : VK_TRUE",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                    ,0x366,
                    "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                   );
    }
    kVar28 = 2;
  }
  kVar12 = This->isCubemap;
  uVar23 = This->numLayers * 6;
  if (kVar12 == false) {
    uVar23 = This->numLayers;
  }
  if (2 < kVar28 - 1) {
    __assert_fail("This->numDimensions >= 1 && This->numDimensions <= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                  ,0x36e,
                  "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                 );
  }
  kVar4 = This->isArray;
  if (kVar28 == 3) {
    if (kVar4 != false) {
      __assert_fail("!This->isArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                    ,900,
                    "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                   );
    }
    VVar24 = VK_IMAGE_VIEW_TYPE_3D;
    local_360 = VK_IMAGE_TYPE_3D;
  }
  else if (kVar28 == 1) {
    VVar24 = (uint)kVar4 << 2;
    local_360 = VK_IMAGE_TYPE_1D;
  }
  else {
    local_360 = VK_IMAGE_TYPE_2D;
    if (kVar12 == false) {
      VVar24 = (uint)kVar4 * 4 + VK_IMAGE_VIEW_TYPE_2D;
    }
    else {
      VVar24 = (uint)kVar4 + (uint)kVar4 * 2 + VK_IMAGE_VIEW_TYPE_CUBE;
    }
  }
  VVar14 = ktxTexture_GetVkFormat(This);
  if (VVar14 == VK_FORMAT_UNDEFINED) {
    return KTX_INVALID_OPERATION;
  }
  local_33c = (uint)kVar12 << 4;
  uVar26 = usageFlags | 2;
  if (tiling != VK_IMAGE_TILING_OPTIMAL) {
    uVar26 = usageFlags;
  }
  local_340 = uVar26 | 3;
  if (This->generateMipmaps == false) {
    local_340 = uVar26;
  }
  pVVar34 = &imageFormatProperties;
  VVar15 = (*(vdi->vkFuncs).vkGetPhysicalDeviceImageFormatProperties)
                     (vdi->physicalDevice,VVar14,local_360,tiling,local_340,local_33c,pVVar34);
  if (VVar15 == VK_ERROR_FORMAT_NOT_SUPPORTED) {
    return KTX_INVALID_OPERATION;
  }
  if (imageFormatProperties.maxArrayLayers < This->numLayers) {
    return KTX_INVALID_OPERATION;
  }
  if (This->generateMipmaps == true) {
    (*(vdi->vkFuncs).vkGetPhysicalDeviceFormatProperties)
              (vdi->physicalDevice,VVar14,&formatProperties);
    if (VVar15 != VK_SUCCESS) {
      __assert_fail("vResult == VK_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                    ,0x3ae,
                    "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                   );
    }
    pVVar21 = &formatProperties;
    if (tiling == VK_IMAGE_TILING_OPTIMAL) {
      pVVar21 = (VkFormatProperties *)&formatProperties.optimalTilingFeatures;
    }
    if ((~pVVar21->linearTilingFeatures & 0xc00) != 0) {
      return KTX_INVALID_OPERATION;
    }
    local_358 = pVVar21->linearTilingFeatures >> 0xc & VK_FILTER_LINEAR;
    uVar26 = This->baseHeight;
    if (This->baseHeight < This->baseWidth) {
      uVar26 = This->baseWidth;
    }
    if (uVar26 <= This->baseDepth) {
      uVar26 = This->baseDepth;
    }
    auVar32._0_8_ = log2((double)uVar26);
    auVar32._8_8_ = extraout_XMM0_Qb;
    auVar32 = roundsd(auVar32,auVar32,9);
    uVar26 = (int)(long)auVar32._0_8_ + 1;
  }
  else {
    uVar26 = This->numLevels;
    local_358 = VK_FILTER_LINEAR;
  }
  if (imageFormatProperties.maxMipLevels < uVar26) {
    return KTX_INVALID_OPERATION;
  }
  bVar30 = true;
  if ((This->classId != ktxTexture2_c) &&
     (kVar28 = ktxTexture_GetRowPitch(This,0), (kVar13 & 3) != 0)) {
    bVar30 = kVar28 == This->baseWidth * kVar13 && This->numLevels == 1;
  }
  local_2b0 = &vdi->vkFuncs;
  kVar28 = This->baseHeight;
  vkTexture->width = This->baseWidth;
  vkTexture->height = kVar28;
  vkTexture->depth = This->baseDepth;
  vkTexture->imageLayout = finalLayout;
  vkTexture->imageFormat = VVar14;
  vkTexture->levelCount = uVar26;
  vkTexture->layerCount = uVar23;
  vkTexture->viewType = VVar24;
  vkTexture->vkDestroyImage = (vdi->vkFuncs).vkDestroyImage;
  vkTexture->vkFreeMemory = (vdi->vkFuncs).vkFreeMemory;
  local_338 = &vdi->cmdBuffer;
  (*(vdi->vkFuncs).vkBeginCommandBuffer)(vdi->cmdBuffer,&cmdBufBeginInfo);
  local_2b8 = (ulong)uVar26;
  if (tiling == VK_IMAGE_TILING_OPTIMAL) {
    stagingMemory = (VkDeviceMemory)0x0;
    pvStack_270 = (void *)0x0;
    local_248 = (uint32_t *)0x0;
    local_258._0_4_ = 0;
    local_258._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
    uStack_250._0_4_ = 0;
    uStack_250._4_4_ = 0;
    local_268._0_4_ = 0;
    local_268._4_4_ = 0;
    VStack_260 = 0;
    numPages = 0xc;
    local_2c8._0_4_ = 0;
    local_2c8._4_4_ = 0;
    mappableMemory = (VkDeviceMemory)0x8;
    pvStack_2d0 = (void *)0x0;
    submitInfo.pNext = (void *)0x0;
    submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
    submitInfo.signalSemaphoreCount = 0;
    submitInfo._60_4_ = 0;
    submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
    submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
    submitInfo.commandBufferCount = 0;
    submitInfo._44_4_ = 0;
    submitInfo.waitSemaphoreCount = 0;
    submitInfo._20_4_ = 0;
    submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
    submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    submitInfo._4_4_ = 0;
    VStack_260 = (*This->vtbl->GetDataSizeUncompressed)(This);
    if (bVar30) {
      kVar28 = This->numLevels;
    }
    else {
      kVar28 = This->numLevels;
      if (This->isArray == false) {
        kVar28 = kVar28 * This->numFaces;
      }
      VStack_260 = VStack_260 + kVar13 * kVar28 * 4;
    }
    pVVar19 = (VkBufferImageCopy *)malloc((ulong)kVar28 * 0x38);
    kVar17 = KTX_OUT_OF_MEMORY;
    if (pVVar19 == (VkBufferImageCopy *)0x0) {
      return KTX_OUT_OF_MEMORY;
    }
    local_258._0_4_ = 1;
    local_258._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
    (*(vdi->vkFuncs).vkCreateBuffer)
              (vdi->device,(VkBufferCreateInfo *)&numPages,vdi->pAllocator,&stagingBuffer);
    (*(vdi->vkFuncs).vkGetBufferMemoryRequirements)(vdi->device,stagingBuffer,&memReqs);
    memAllocInfo.allocationSize = memReqs.size;
    uVar16 = ktxVulkanDeviceInfo_getMemoryType(vdi,memReqs.memoryTypeBits,6);
    memAllocInfo.memoryTypeIndex = uVar16;
    if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
      VVar15 = (*(vdi->vkFuncs).vkAllocateMemory)
                         (vdi->device,&memAllocInfo,vdi->pAllocator,&stagingMemory);
      if (VVar15 == VK_SUCCESS) {
        uVar18 = 0;
        (*(vdi->vkFuncs).vkBindBufferMemory)(vdi->device,stagingBuffer,stagingMemory,0);
        (*(vdi->vkFuncs).vkMapMemory)
                  (vdi->device,stagingMemory,0,memReqs.size,0,&pMappedStagingBuffer);
LAB_001fcd2a:
        local_2a0 = 0;
        uVar2 = This->numLayers;
        uVar3 = This->numFaces;
        local_298 = CONCAT44(uVar2,uVar3);
        local_290 = pMappedStagingBuffer;
        local_284 = This->numDimensions;
        __src = This->pData;
        local_2c0 = uVar18;
        mappableImage = (VkImage)pVVar19;
        local_288 = kVar13;
        if (bVar30) {
          if (__src == (ktx_uint8_t *)0x0) {
            kVar17 = (*This->vtbl->LoadImageData)
                               (This,pMappedStagingBuffer,memAllocInfo.allocationSize);
            if (kVar17 != KTX_SUCCESS) {
              return kVar17;
            }
          }
          else {
            if (memAllocInfo.allocationSize < This->dataSize) {
              __assert_fail("This->dataSize <= memAllocInfo.allocationSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                            ,0x474,
                            "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                           );
            }
            memcpy(pMappedStagingBuffer,__src,This->dataSize);
          }
          (*This->vtbl->IterateLevels)(This,optimalTilingCallback,&mappableImage);
        }
        else if (__src == (ktx_uint8_t *)0x0) {
          (*This->vtbl->IterateLoadLevelFaces)(This,optimalTilingPadCallback,&mappableImage);
        }
        else {
          ktxTexture_IterateLevelFaces(This,optimalTilingPadCallback,&mappableImage);
        }
        local_240 = pVVar19;
        if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
          (*(vdi->vkFuncs).vkUnmapMemory)(vdi->device,stagingMemory);
        }
        else {
          (*subAllocatorCallbacks->memoryUnmapFuncPtr)(local_2c0,0);
        }
        local_1e8.imageType = local_360;
        local_1e8.flags = local_33c;
        local_1e8.arrayLayers = uVar23;
        local_1e8.mipLevels = (uint32_t)local_2b8;
        local_1e8.samples = VK_SAMPLE_COUNT_1_BIT;
        local_1e8.tiling = VK_IMAGE_TILING_OPTIMAL;
        local_1e8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        local_1e8.usage = local_340;
        local_1e8._80_8_ = local_1e8._80_8_ & 0xffffffff00000000;
        uVar6 = vkTexture->width;
        uVar9 = vkTexture->height;
        local_1e8.extent.depth = vkTexture->depth;
        ppVVar1 = &vkTexture->image;
        local_1e8.format = VVar14;
        local_1e8.extent.width = uVar6;
        local_1e8.extent.height = uVar9;
        (*(vdi->vkFuncs).vkCreateImage)(vdi->device,&local_1e8,vdi->pAllocator,ppVVar1);
        (*(vdi->vkFuncs).vkGetImageMemoryRequirements)(vdi->device,vkTexture->image,&memReqs);
        memAllocInfo.allocationSize = memReqs.size;
        uVar16 = ktxVulkanDeviceInfo_getMemoryType(vdi,memReqs.memoryTypeBits,1);
        uVar35 = (undefined4)((ulong)pVVar34 >> 0x20);
        memAllocInfo.memoryTypeIndex = uVar16;
        if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
          (*(vdi->vkFuncs).vkAllocateMemory)
                    (vdi->device,&memAllocInfo,vdi->pAllocator,&vkTexture->deviceMemory);
          uVar35 = (undefined4)((ulong)pVVar34 >> 0x20);
          (*(vdi->vkFuncs).vkBindImageMemory)
                    (vdi->device,vkTexture->image,vkTexture->deviceMemory,0);
        }
        else {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = stack0xfffffffffffffec0;
          _formatProperties = auVar11 << 0x40;
          uVar18 = (*subAllocatorCallbacks->allocMemFuncPtr)
                             (&memAllocInfo,&memReqs,(uint64_t *)&formatProperties);
          vkTexture->allocationId = uVar18;
          if (uVar18 == 0) {
            return KTX_OUT_OF_MEMORY;
          }
          if (1 < (ulong)formatProperties._0_8_) {
            return KTX_UNSUPPORTED_FEATURE;
          }
          (*subAllocatorCallbacks->bindImageFuncPtr)(*ppVVar1,uVar18);
        }
        kVar13 = This->numLevels;
        pVVar38 = (VkImageMemoryBarrier *)&formatProperties;
        stack0xfffffffffffffebc = SUB1612((undefined1  [16])0x0,4);
        formatProperties.linearTilingFeatures = 0x2d;
        uVar36 = 0;
        uVar33 = 0;
        uVar37 = 1;
        (*(vdi->vkFuncs).vkCmdPipelineBarrier)
                  (vdi->cmdBuffer,0x10000,0x10000,0,0,(VkMemoryBarrier *)0x0,0,
                   (VkBufferMemoryBarrier *)0x0,1,pVVar38);
        pVVar19 = local_240;
        (*(vdi->vkFuncs).vkCmdCopyBufferToImage)
                  (vdi->cmdBuffer,stagingBuffer,*ppVVar1,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,kVar28
                   ,local_240);
        free(pVVar19);
        ppVVar29 = local_338;
        if (This->generateMipmaps == true) {
          generateMipmaps(vkTexture,vdi,local_358,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
          ppVVar29 = local_338;
        }
        else {
          pVVar7 = *local_338;
          pVVar20 = *ppVVar1;
          pkVar25 = local_2b0;
          puVar27 = (undefined8 *)&stack0xfffffffffffffb78;
          for (lVar22 = 0x1e; lVar22 != 0; lVar22 = lVar22 + -1) {
            *puVar27 = pkVar25->vkGetInstanceProcAddr;
            pkVar25 = (ktxVulkanFunctions *)((long)pkVar25 + (ulong)bVar31 * -0x10 + 8);
            puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
          }
          vkFuncs_00.vkGetInstanceProcAddr._4_4_ = uVar35;
          vkFuncs_00.vkGetInstanceProcAddr._0_4_ = uVar33;
          vkFuncs_00.vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)uVar36;
          vkFuncs_00.vkAllocateCommandBuffers._0_4_ = uVar37;
          vkFuncs_00.vkAllocateCommandBuffers._4_4_ = in_stack_fffffffffffffb8c;
          vkFuncs_00.vkAllocateMemory = (PFN_vkAllocateMemory)pVVar38;
          vkFuncs_00.vkBeginCommandBuffer =
               (PFN_vkBeginCommandBuffer)in_stack_fffffffffffffb98._0_8_;
          vkFuncs_00.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_fffffffffffffb98._8_8_;
          vkFuncs_00.vkBindImageMemory = (PFN_vkBindImageMemory)in_stack_fffffffffffffb98._16_8_;
          vkFuncs_00.vkCmdBlitImage = (PFN_vkCmdBlitImage)in_stack_fffffffffffffb98._24_8_;
          vkFuncs_00.vkCmdCopyBufferToImage =
               (PFN_vkCmdCopyBufferToImage)in_stack_fffffffffffffb98._32_8_;
          vkFuncs_00.vkCmdPipelineBarrier =
               (PFN_vkCmdPipelineBarrier)in_stack_fffffffffffffb98._40_8_;
          vkFuncs_00.vkCreateImage = (PFN_vkCreateImage)in_stack_fffffffffffffb98._48_8_;
          vkFuncs_00.vkDestroyImage = (PFN_vkDestroyImage)in_stack_fffffffffffffb98._56_8_;
          vkFuncs_00.vkCreateBuffer = (PFN_vkCreateBuffer)in_stack_fffffffffffffb98._64_8_;
          vkFuncs_00.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_fffffffffffffb98._72_8_;
          vkFuncs_00.vkCreateFence = (PFN_vkCreateFence)in_stack_fffffffffffffb98._80_8_;
          vkFuncs_00.vkDestroyFence = (PFN_vkDestroyFence)in_stack_fffffffffffffb98._88_8_;
          vkFuncs_00.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)in_stack_fffffffffffffb98._96_8_;
          vkFuncs_00.vkFreeCommandBuffers =
               (PFN_vkFreeCommandBuffers)in_stack_fffffffffffffb98._104_8_;
          vkFuncs_00.vkFreeMemory = (PFN_vkFreeMemory)in_stack_fffffffffffffb98._112_8_;
          vkFuncs_00.vkGetBufferMemoryRequirements =
               (PFN_vkGetBufferMemoryRequirements)in_stack_fffffffffffffb98._120_8_;
          vkFuncs_00.vkGetImageMemoryRequirements =
               (PFN_vkGetImageMemoryRequirements)in_stack_fffffffffffffb98._128_8_;
          vkFuncs_00.vkGetImageSubresourceLayout =
               (PFN_vkGetImageSubresourceLayout)in_stack_fffffffffffffb98._136_8_;
          vkFuncs_00.vkGetPhysicalDeviceImageFormatProperties =
               (PFN_vkGetPhysicalDeviceImageFormatProperties)in_stack_fffffffffffffb98._144_8_;
          vkFuncs_00.vkGetPhysicalDeviceFormatProperties =
               (PFN_vkGetPhysicalDeviceFormatProperties)in_stack_fffffffffffffb98._152_8_;
          vkFuncs_00.vkGetPhysicalDeviceMemoryProperties =
               (PFN_vkGetPhysicalDeviceMemoryProperties)in_stack_fffffffffffffb98._160_8_;
          vkFuncs_00.vkMapMemory = (PFN_vkMapMemory)in_stack_fffffffffffffb98._168_8_;
          vkFuncs_00.vkQueueSubmit = (PFN_vkQueueSubmit)in_stack_fffffffffffffb98._176_8_;
          vkFuncs_00.vkQueueWaitIdle = (PFN_vkQueueWaitIdle)in_stack_fffffffffffffb98._184_8_;
          vkFuncs_00.vkUnmapMemory = (PFN_vkUnmapMemory)in_stack_fffffffffffffb98._192_8_;
          vkFuncs_00.vkWaitForFences = (PFN_vkWaitForFences)in_stack_fffffffffffffb98._200_8_;
          subresourceRange_00.levelCount = kVar13;
          subresourceRange_00.aspectMask = 1;
          subresourceRange_00.baseMipLevel = 0;
          subresourceRange_00.baseArrayLayer = 0;
          subresourceRange_00.layerCount = uVar23;
          setImageLayout(vkFuncs_00,pVVar7,pVVar20,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,finalLayout,
                         subresourceRange_00);
        }
        (*(vdi->vkFuncs).vkEndCommandBuffer)(vdi->cmdBuffer);
        (*(vdi->vkFuncs).vkCreateFence)
                  (vdi->device,(VkFenceCreateInfo *)&mappableMemory,vdi->pAllocator,&copyFence);
        submitInfo.commandBufferCount = 1;
        submitInfo.pCommandBuffers = ppVVar29;
        (*(vdi->vkFuncs).vkQueueSubmit)(vdi->queue,1,&submitInfo,copyFence);
        (*(vdi->vkFuncs).vkWaitForFences)(vdi->device,1,&copyFence,1,100000000000);
        (*(vdi->vkFuncs).vkDestroyFence)(vdi->device,copyFence,vdi->pAllocator);
        if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
          (*(vdi->vkFuncs).vkFreeMemory)(vdi->device,stagingMemory,vdi->pAllocator);
        }
        else {
          (*subAllocatorCallbacks->freeMemFuncPtr)(local_2c0);
        }
        (*(vdi->vkFuncs).vkDestroyBuffer)(vdi->device,stagingBuffer,vdi->pAllocator);
        return KTX_SUCCESS;
      }
    }
    else {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = stack0xfffffffffffffec0;
      _formatProperties = auVar10 << 0x40;
      uVar18 = (*subAllocatorCallbacks->allocMemFuncPtr)
                         (&memAllocInfo,&memReqs,(uint64_t *)&formatProperties);
      if (uVar18 == 0) {
        kVar17 = KTX_OUT_OF_MEMORY;
      }
      else {
        if ((ulong)formatProperties._0_8_ < 2) {
          (*subAllocatorCallbacks->bindBufferFuncPtr)(stagingBuffer,uVar18);
          (*subAllocatorCallbacks->memoryMapFuncPtr)(uVar18,0,&memReqs.size,&pMappedStagingBuffer);
          goto LAB_001fcd2a;
        }
        kVar17 = KTX_UNSUPPORTED_FEATURE;
      }
    }
    free(pVVar19);
    return kVar17;
  }
  mappableMemory = (VkDeviceMemory)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  local_1e8.imageType = local_360;
  local_1e8.flags = local_33c;
  uVar5 = vkTexture->width;
  uVar8 = vkTexture->height;
  local_1e8.extent.depth = vkTexture->depth;
  local_1e8.arrayLayers = uVar23;
  local_1e8.mipLevels = uVar26;
  local_1e8.samples = VK_SAMPLE_COUNT_1_BIT;
  local_1e8.tiling = VK_IMAGE_TILING_LINEAR;
  local_1e8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_1e8.usage = local_340;
  local_1e8.initialLayout = VK_IMAGE_LAYOUT_PREINITIALIZED;
  local_1e8.format = VVar14;
  local_1e8.extent.width = uVar5;
  local_1e8.extent.height = uVar8;
  (*(vdi->vkFuncs).vkCreateImage)(vdi->device,&local_1e8,vdi->pAllocator,&mappableImage);
  (*(vdi->vkFuncs).vkGetImageMemoryRequirements)(vdi->device,mappableImage,&memReqs);
  memAllocInfo.allocationSize = memReqs.size;
  uVar16 = ktxVulkanDeviceInfo_getMemoryType(vdi,memReqs.memoryTypeBits,6);
  memAllocInfo.memoryTypeIndex = uVar16;
  if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
    VVar15 = (*(vdi->vkFuncs).vkAllocateMemory)
                       (vdi->device,&memAllocInfo,vdi->pAllocator,&mappableMemory);
    if (VVar15 == VK_SUCCESS) {
      (*(vdi->vkFuncs).vkBindImageMemory)(vdi->device,mappableImage,mappableMemory,0);
      goto LAB_001fca67;
    }
  }
  else {
    numPages = 0;
    uVar18 = (*subAllocatorCallbacks->allocMemFuncPtr)(&memAllocInfo,&memReqs,&numPages);
    vkTexture->allocationId = uVar18;
    if (uVar18 != 0) {
      if (1 < numPages) {
        return KTX_UNSUPPORTED_FEATURE;
      }
      (*subAllocatorCallbacks->bindImageFuncPtr)(mappableImage,uVar18);
LAB_001fca67:
      pkVar25 = local_2b0;
      memcpy(&formatProperties,local_2b0,0xf0);
      if (bVar30) {
        iterCb = linearTilingCallback;
      }
      else {
        iterCb = linearTilingPadCallback;
      }
      local_40 = This;
      if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
        (*(vdi->vkFuncs).vkMapMemory)(vdi->device,mappableMemory,0,memReqs.size,0,&local_48);
      }
      else {
        (*subAllocatorCallbacks->memoryMapFuncPtr)
                  (vkTexture->allocationId,0,&memReqs.size,&local_48);
      }
      kVar12 = ktxTexture_isActiveStream(This);
      if (kVar12) {
        (*This->vtbl->IterateLoadLevelFaces)(This,iterCb,&formatProperties);
      }
      else {
        ktxTexture_IterateLevelFaces(This,iterCb,&formatProperties);
      }
      if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
        (*(vdi->vkFuncs).vkUnmapMemory)(vdi->device,mappableMemory);
        vkTexture->deviceMemory = mappableMemory;
        pVVar20 = mappableImage;
      }
      else {
        (*subAllocatorCallbacks->memoryUnmapFuncPtr)(vkTexture->allocationId,0);
        pVVar20 = mappableImage;
      }
      ppVVar29 = local_338;
      vkTexture->image = pVVar20;
      if (This->generateMipmaps == true) {
        generateMipmaps(vkTexture,vdi,local_358,VK_IMAGE_LAYOUT_PREINITIALIZED);
        ppVVar29 = local_338;
      }
      else {
        numPages = 1;
        pvStack_270 = (void *)(local_2b8 & 0xffffffff);
        local_268._0_4_ = uVar23;
        pVVar7 = *local_338;
        puVar27 = (undefined8 *)&stack0xfffffffffffffb78;
        for (lVar22 = 0x1e; lVar22 != 0; lVar22 = lVar22 + -1) {
          *puVar27 = pkVar25->vkGetInstanceProcAddr;
          pkVar25 = (ktxVulkanFunctions *)((long)pkVar25 + (ulong)bVar31 * -0x10 + 8);
          puVar27 = puVar27 + (ulong)bVar31 * -2 + 1;
        }
        vkFuncs.vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)in_stack_fffffffffffffb80;
        vkFuncs.vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)pVVar34;
        vkFuncs.vkAllocateCommandBuffers._0_4_ = in_stack_fffffffffffffb88;
        vkFuncs.vkAllocateCommandBuffers._4_4_ = in_stack_fffffffffffffb8c;
        vkFuncs.vkAllocateMemory = (PFN_vkAllocateMemory)in_stack_fffffffffffffb90;
        vkFuncs.vkBeginCommandBuffer = (PFN_vkBeginCommandBuffer)in_stack_fffffffffffffb98._0_8_;
        vkFuncs.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_fffffffffffffb98._8_8_;
        vkFuncs.vkBindImageMemory = (PFN_vkBindImageMemory)in_stack_fffffffffffffb98._16_8_;
        vkFuncs.vkCmdBlitImage = (PFN_vkCmdBlitImage)in_stack_fffffffffffffb98._24_8_;
        vkFuncs.vkCmdCopyBufferToImage =
             (PFN_vkCmdCopyBufferToImage)in_stack_fffffffffffffb98._32_8_;
        vkFuncs.vkCmdPipelineBarrier = (PFN_vkCmdPipelineBarrier)in_stack_fffffffffffffb98._40_8_;
        vkFuncs.vkCreateImage = (PFN_vkCreateImage)in_stack_fffffffffffffb98._48_8_;
        vkFuncs.vkDestroyImage = (PFN_vkDestroyImage)in_stack_fffffffffffffb98._56_8_;
        vkFuncs.vkCreateBuffer = (PFN_vkCreateBuffer)in_stack_fffffffffffffb98._64_8_;
        vkFuncs.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_fffffffffffffb98._72_8_;
        vkFuncs.vkCreateFence = (PFN_vkCreateFence)in_stack_fffffffffffffb98._80_8_;
        vkFuncs.vkDestroyFence = (PFN_vkDestroyFence)in_stack_fffffffffffffb98._88_8_;
        vkFuncs.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)in_stack_fffffffffffffb98._96_8_;
        vkFuncs.vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)in_stack_fffffffffffffb98._104_8_;
        vkFuncs.vkFreeMemory = (PFN_vkFreeMemory)in_stack_fffffffffffffb98._112_8_;
        vkFuncs.vkGetBufferMemoryRequirements =
             (PFN_vkGetBufferMemoryRequirements)in_stack_fffffffffffffb98._120_8_;
        vkFuncs.vkGetImageMemoryRequirements =
             (PFN_vkGetImageMemoryRequirements)in_stack_fffffffffffffb98._128_8_;
        vkFuncs.vkGetImageSubresourceLayout =
             (PFN_vkGetImageSubresourceLayout)in_stack_fffffffffffffb98._136_8_;
        vkFuncs.vkGetPhysicalDeviceImageFormatProperties =
             (PFN_vkGetPhysicalDeviceImageFormatProperties)in_stack_fffffffffffffb98._144_8_;
        vkFuncs.vkGetPhysicalDeviceFormatProperties =
             (PFN_vkGetPhysicalDeviceFormatProperties)in_stack_fffffffffffffb98._152_8_;
        vkFuncs.vkGetPhysicalDeviceMemoryProperties =
             (PFN_vkGetPhysicalDeviceMemoryProperties)in_stack_fffffffffffffb98._160_8_;
        vkFuncs.vkMapMemory = (PFN_vkMapMemory)in_stack_fffffffffffffb98._168_8_;
        vkFuncs.vkQueueSubmit = (PFN_vkQueueSubmit)in_stack_fffffffffffffb98._176_8_;
        vkFuncs.vkQueueWaitIdle = (PFN_vkQueueWaitIdle)in_stack_fffffffffffffb98._184_8_;
        vkFuncs.vkUnmapMemory = (PFN_vkUnmapMemory)in_stack_fffffffffffffb98._192_8_;
        vkFuncs.vkWaitForFences = (PFN_vkWaitForFences)in_stack_fffffffffffffb98._200_8_;
        subresourceRange._8_8_ = pvStack_270;
        subresourceRange.aspectMask = (undefined4)numPages;
        subresourceRange.baseMipLevel = numPages._4_4_;
        subresourceRange.layerCount = (VkBufferCreateFlags)local_268;
        setImageLayout(vkFuncs,pVVar7,pVVar20,VK_IMAGE_LAYOUT_PREINITIALIZED,finalLayout,
                       subresourceRange);
      }
      (*(vdi->vkFuncs).vkEndCommandBuffer)(vdi->cmdBuffer);
      submitInfo._16_8_ = submitInfo._16_8_ & 0xffffffff00000000;
      submitInfo.commandBufferCount = 1;
      submitInfo.pCommandBuffers = ppVVar29;
      (*(vdi->vkFuncs).vkQueueSubmit)(vdi->queue,1,&submitInfo,(VkFence)0x0);
      (*(vdi->vkFuncs).vkQueueWaitIdle)(vdi->queue);
      return KTX_SUCCESS;
    }
  }
  return KTX_OUT_OF_MEMORY;
}

Assistant:

KTX_error_code
ktxTexture_VkUploadEx_WithSuballocator(ktxTexture* This, ktxVulkanDeviceInfo* vdi,
                                       ktxVulkanTexture* vkTexture,
                                       VkImageTiling tiling,
                                       VkImageUsageFlags usageFlags,
                                       VkImageLayout finalLayout,
                                       ktxVulkanTexture_subAllocatorCallbacks* subAllocatorCallbacks)
{
    KTX_error_code           kResult;
    VkFilter                 blitFilter = VK_FILTER_LINEAR;
    VkFormat                 vkFormat;
    VkImageType              imageType;
    VkImageViewType          viewType;
    VkImageCreateFlags       createFlags = 0;
    VkImageFormatProperties  imageFormatProperties;
    VkResult                 vResult;
    VkCommandBufferBeginInfo cmdBufBeginInfo = {
        .sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
        .pNext = NULL
    };
    VkImageCreateInfo        imageCreateInfo = {
         .sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
         .pNext = NULL
    };
    VkMemoryAllocateInfo     memAllocInfo = {
        .sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,
        .pNext = NULL,
        .allocationSize = 0,
        .memoryTypeIndex = 0
    };
    VkMemoryRequirements     memReqs;
    ktx_uint32_t             numImageLayers, numImageLevels;
    ktx_uint32_t elementSize = ktxTexture_GetElementSize(This);
    ktx_bool_t               canUseFasterPath;
    ktx_bool_t               useSuballocator = false;
    if (subAllocatorCallbacks) {
        if (subAllocatorCallbacks->allocMemFuncPtr &&
            subAllocatorCallbacks->bindBufferFuncPtr &&
            subAllocatorCallbacks->bindImageFuncPtr &&
            subAllocatorCallbacks->memoryMapFuncPtr &&
            subAllocatorCallbacks->memoryUnmapFuncPtr &&
            subAllocatorCallbacks->freeMemFuncPtr)
            useSuballocator = true;
        else
            return KTX_INVALID_VALUE;
    }

    if (!vdi || !This || !vkTexture) {
        return KTX_INVALID_VALUE;
    }

    if (!This->pData && !ktxTexture_isActiveStream(This)) {
        /* Nothing to upload. */
        return KTX_INVALID_OPERATION;
    }

    /* _ktxCheckHeader should have caught this. */
    assert(This->numFaces == 6 ? This->numDimensions == 2 : VK_TRUE);

    numImageLayers = This->numLayers;
    if (This->isCubemap) {
        numImageLayers *= 6;
        createFlags = VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;
    }

    assert(This->numDimensions >= 1 && This->numDimensions <= 3);
    switch (This->numDimensions) {
      case 1:
        imageType = VK_IMAGE_TYPE_1D;
        viewType = This->isArray ?
                        VK_IMAGE_VIEW_TYPE_1D_ARRAY : VK_IMAGE_VIEW_TYPE_1D;
        break;
      case 2:
      default: // To keep compilers happy.
        imageType = VK_IMAGE_TYPE_2D;
        if (This->isCubemap)
            viewType = This->isArray ?
                        VK_IMAGE_VIEW_TYPE_CUBE_ARRAY : VK_IMAGE_VIEW_TYPE_CUBE;
        else
            viewType = This->isArray ?
                        VK_IMAGE_VIEW_TYPE_2D_ARRAY : VK_IMAGE_VIEW_TYPE_2D;
        break;
      case 3:
        imageType = VK_IMAGE_TYPE_3D;
        /* 3D array textures not supported in Vulkan. Attempts to create or
         * load them should have been trapped long before this.
         */
        assert(!This->isArray);
        viewType = VK_IMAGE_VIEW_TYPE_3D;
        break;
    }

    vkFormat = ktxTexture_GetVkFormat(This);
    if (vkFormat == VK_FORMAT_UNDEFINED) {
        return KTX_INVALID_OPERATION;
    }

    /* Get device properties for the requested image format */
    if (tiling == VK_IMAGE_TILING_OPTIMAL) {
        // Ensure we can copy from staging buffer to image.
        usageFlags |= VK_IMAGE_USAGE_TRANSFER_DST_BIT;
    }
    if (This->generateMipmaps) {
        // Ensure we can blit between levels.
        usageFlags |= (VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT);
    }
    vResult = vdi->vkFuncs.vkGetPhysicalDeviceImageFormatProperties(vdi->physicalDevice,
                                                      vkFormat,
                                                      imageType,
                                                      tiling,
                                                      usageFlags,
                                                      createFlags,
                                                      &imageFormatProperties);
    if (vResult == VK_ERROR_FORMAT_NOT_SUPPORTED) {
        return KTX_INVALID_OPERATION;
    }
    if (This->numLayers > imageFormatProperties.maxArrayLayers) {
        return KTX_INVALID_OPERATION;
    }

    if (This->generateMipmaps) {
        uint32_t max_dim;
        VkFormatProperties    formatProperties;
        VkFormatFeatureFlags  formatFeatureFlags;
        VkFormatFeatureFlags  neededFeatures
            = VK_FORMAT_FEATURE_BLIT_DST_BIT | VK_FORMAT_FEATURE_BLIT_SRC_BIT;
        vdi->vkFuncs.vkGetPhysicalDeviceFormatProperties(vdi->physicalDevice,
                                            vkFormat,
                                            &formatProperties);
        assert(vResult == VK_SUCCESS);
        if (tiling == VK_IMAGE_TILING_OPTIMAL)
            formatFeatureFlags = formatProperties.optimalTilingFeatures;
        else
            formatFeatureFlags = formatProperties.linearTilingFeatures;

        if ((formatFeatureFlags & neededFeatures) != neededFeatures)
            return KTX_INVALID_OPERATION;

        if (formatFeatureFlags & VK_FORMAT_FEATURE_SAMPLED_IMAGE_FILTER_LINEAR_BIT)
            blitFilter = VK_FILTER_LINEAR;
        else
            blitFilter = VK_FILTER_NEAREST; // XXX INVALID_OP?

        max_dim = MAX(MAX(This->baseWidth, This->baseHeight), This->baseDepth);
        numImageLevels = (uint32_t)floor(log2(max_dim)) + 1;
    } else {
        numImageLevels = This->numLevels;
    }

    if (numImageLevels > imageFormatProperties.maxMipLevels) {
        return KTX_INVALID_OPERATION;
    }

    if (This->classId == ktxTexture2_c) {
        canUseFasterPath = KTX_TRUE;
    } else {
        ktx_uint32_t actualRowPitch = ktxTexture_GetRowPitch(This, 0);
        ktx_uint32_t tightRowPitch = elementSize * This->baseWidth;
        // If the texture's images do not have any row padding, we can use a
        // faster path. Only uncompressed textures might have padding.
        //
        // The first test in the if will match compressed textures, because
        // they all have a block size that is a multiple of 4, as well as
        // a class of uncompressed textures that will never need padding.
        //
        // The second test matches textures whose level 0 has no padding. Any
        // texture whose block size is not a multiple of 4 will need padding
        // at some miplevel even if level 0 does not. So, if more than 1 level
        // exists, we must use the slower path.
        //
        // Note all elementSizes > 4 Will be a multiple of 4, so only
        // elementSizes of 1, 2 & 3 are a concern here.
        if (elementSize % 4 == 0  /* There'll be no padding at any level. */
               /* There is no padding at level 0 and no other levels. */
            || (This->numLevels == 1 && actualRowPitch == tightRowPitch))
            canUseFasterPath = KTX_TRUE;
        else
            canUseFasterPath = KTX_FALSE;
    }

    vkTexture->width = This->baseWidth;
    vkTexture->height = This->baseHeight;
    vkTexture->depth = This->baseDepth;
    vkTexture->imageLayout = finalLayout;
    vkTexture->imageFormat = vkFormat;
    vkTexture->levelCount = numImageLevels;
    vkTexture->layerCount = numImageLayers;
    vkTexture->viewType = viewType;
    vkTexture->vkDestroyImage = vdi->vkFuncs.vkDestroyImage;
    vkTexture->vkFreeMemory = vdi->vkFuncs.vkFreeMemory;

    VK_CHECK_RESULT(
            vdi->vkFuncs.vkBeginCommandBuffer(vdi->cmdBuffer, &cmdBufBeginInfo)
            );

    if (tiling == VK_IMAGE_TILING_OPTIMAL)
    {
        // Create a host-visible staging buffer that contains the raw image data
        VkBuffer stagingBuffer;
        VkDeviceMemory stagingMemory = VK_NULL_HANDLE;
        VkBufferImageCopy* copyRegions;
        VkDeviceSize textureSize;
        VkBufferCreateInfo bufferCreateInfo = {
          .sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,
          .pNext = NULL
        };
        VkImageSubresourceRange subresourceRange;
        VkFence copyFence;
        VkFenceCreateInfo fenceCreateInfo = {
            .sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,
            .pNext = NULL,
            .flags = VK_FLAGS_NONE
        };
        VkSubmitInfo submitInfo = {
            .sType = VK_STRUCTURE_TYPE_SUBMIT_INFO,
            .pNext = NULL
        };
        ktx_uint8_t* pMappedStagingBuffer;
        ktx_uint32_t numCopyRegions;
        user_cbdata_optimal cbData;


        textureSize = ktxTexture_GetDataSizeUncompressed(This);
        bufferCreateInfo.size = textureSize;
        if (canUseFasterPath) {
            /*
             * Because all array layers and faces are the same size they can
             * be copied in a single operation so there'll be 1 copy per mip
             * level.
             */
            numCopyRegions = This->numLevels;
        } else {
            /*
             * Have to copy all images individually into the staging
             * buffer so we can place them at correct multiples of
             * elementSize and 4 and also need a copy region per image
             * in case they end up with padding between them.
             */
            numCopyRegions = This->isArray ? This->numLevels
                                  : This->numLevels * This->numFaces;
            /*
             * Add extra space to allow for possible padding described
             * above. A bit ad-hoc but it's only a small amount of
             * memory.
             */
            bufferCreateInfo.size += numCopyRegions * elementSize * 4;
        }
        copyRegions = (VkBufferImageCopy*)malloc(sizeof(VkBufferImageCopy)
                                                   * numCopyRegions);
        if (copyRegions == NULL) {
            return KTX_OUT_OF_MEMORY;
        }

        // This buffer is used as a transfer source for the buffer copy
        bufferCreateInfo.usage = VK_BUFFER_USAGE_TRANSFER_SRC_BIT;
        bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateBuffer(vdi->device, &bufferCreateInfo,
                                       vdi->pAllocator, &stagingBuffer));

        // Get memory requirements for the staging buffer (alignment,
        // memory type bits)
        vdi->vkFuncs.vkGetBufferMemoryRequirements(vdi->device, stagingBuffer, &memReqs);

        memAllocInfo.allocationSize = memReqs.size;
        // Get memory type index for a host visible buffer
        memAllocInfo.memoryTypeIndex = ktxVulkanDeviceInfo_getMemoryType(
                vdi,
                memReqs.memoryTypeBits,
                VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT
              | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT
        );

        uint64_t stagingAllocId = 0ull;
        if (!useSuballocator) {
            vResult = vdi->vkFuncs.vkAllocateMemory(vdi->device, &memAllocInfo,
                vdi->pAllocator, &stagingMemory);
            if (vResult != VK_SUCCESS) {
                free(copyRegions);
                return KTX_OUT_OF_MEMORY;
            }
            VK_CHECK_RESULT(
                    vdi->vkFuncs.vkBindBufferMemory(vdi->device, stagingBuffer,
                        stagingMemory, 0));

            VK_CHECK_RESULT(
                    vdi->vkFuncs.vkMapMemory(vdi->device, stagingMemory, 0,
                        memReqs.size, 0,
                        (void**)&pMappedStagingBuffer));
        }
        else {
            uint64_t numPages = 0ull;
            stagingAllocId = subAllocatorCallbacks->allocMemFuncPtr(&memAllocInfo, &memReqs, &numPages);
            if (stagingAllocId == 0ull) {
                free(copyRegions);
                return KTX_OUT_OF_MEMORY;
            }
            if (numPages > 1ull) { // Sparse binding of KTX textures is unsupported for the moment
                free(copyRegions);
                return KTX_UNSUPPORTED_FEATURE;
            }
            VK_CHECK_RESULT(
                subAllocatorCallbacks->bindBufferFuncPtr(stagingBuffer, stagingAllocId));
            VK_CHECK_RESULT(
                subAllocatorCallbacks->memoryMapFuncPtr(stagingAllocId, 0ull, 
                &memReqs.size,
                (void**)&pMappedStagingBuffer));
        }

        cbData.offset = 0;
        cbData.region = copyRegions;
        cbData.numFaces = This->numFaces;
        cbData.numLayers = This->numLayers;
        cbData.dest = pMappedStagingBuffer;
        cbData.elementSize = elementSize;
        cbData.numDimensions = This->numDimensions;
#if defined(_DEBUG)
        cbData.regionsArrayEnd = copyRegions + numCopyRegions;
#endif
        if (canUseFasterPath) {
            // Bulk load the data to the staging buffer and iterate
            // over levels.

            if (This->pData) {
                // Image data has already been loaded. Copy to staging
                // buffer.
                assert(This->dataSize <= memAllocInfo.allocationSize);
                memcpy(pMappedStagingBuffer, This->pData, This->dataSize);
            } else {
                /* Load the image data directly into the staging buffer. */
                /* The strange cast quiets an Xcode warning when building
                 * for the Generic iOS Device where size_t is 32-bit even
                 * when building for arm64. */
                kResult = ktxTexture_LoadImageData(This,
                                      pMappedStagingBuffer,
                                      (ktx_size_t)memAllocInfo.allocationSize);
                if (kResult != KTX_SUCCESS)
                    return kResult;
            }

            // Iterate over mip levels to set up the copy regions.
            kResult = ktxTexture_IterateLevels(This,
                                               optimalTilingCallback,
                                               &cbData);
            // XXX Check for possible errors.
        } else {
            // Iterate over face-levels with callback that copies the
            // face-levels to Vulkan-valid offsets in the staging buffer while
            // removing padding. Using face-levels minimizes pre-staging-buffer
            // buffering, in the event the data is not already loaded.
            if (This->pData) {
                kResult = ktxTexture_IterateLevelFaces(
                                            This,
                                            optimalTilingPadCallback,
                                            &cbData);
            } else {
                kResult = ktxTexture_IterateLoadLevelFaces(
                                            This,
                                            optimalTilingPadCallback,
                                            &cbData);
                // XXX Check for possible errors.
            }
        }

        if (!useSuballocator)
            vdi->vkFuncs.vkUnmapMemory(vdi->device, stagingMemory);
        else
            subAllocatorCallbacks->memoryUnmapFuncPtr(stagingAllocId, 0ull);

        // Create optimal tiled target image
        imageCreateInfo.imageType = imageType;
        imageCreateInfo.flags = createFlags;
        imageCreateInfo.format = vkFormat;
        // numImageLevels ensures enough levels for generateMipmaps.
        imageCreateInfo.mipLevels = numImageLevels;
        imageCreateInfo.arrayLayers = numImageLayers;
        imageCreateInfo.samples = VK_SAMPLE_COUNT_1_BIT;
        imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
        imageCreateInfo.usage = usageFlags;
        imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        imageCreateInfo.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
        imageCreateInfo.extent.width = vkTexture->width;
        imageCreateInfo.extent.height = vkTexture->height;
        imageCreateInfo.extent.depth = vkTexture->depth;

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateImage(vdi->device, &imageCreateInfo,
                                      vdi->pAllocator, &vkTexture->image));

        vdi->vkFuncs.vkGetImageMemoryRequirements(vdi->device, vkTexture->image, &memReqs);

        memAllocInfo.allocationSize = memReqs.size;
        memAllocInfo.memoryTypeIndex = ktxVulkanDeviceInfo_getMemoryType(
            vdi, memReqs.memoryTypeBits,
            VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

        if (!useSuballocator) {
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkAllocateMemory(vdi->device, &memAllocInfo,
                    vdi->pAllocator,
                    &vkTexture->deviceMemory));
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkBindImageMemory(vdi->device, vkTexture->image,
                    vkTexture->deviceMemory, 0));
        }
        else {
            uint64_t numPages = 0ull;
            vkTexture->allocationId = subAllocatorCallbacks->allocMemFuncPtr(&memAllocInfo, &memReqs, &numPages);
            if (vkTexture->allocationId == 0ull) {
                return KTX_OUT_OF_MEMORY;
            }
            if(numPages > 1ull) { // Sparse binding of KTX textures is unsupported for the moment
                return KTX_UNSUPPORTED_FEATURE;
            }
            VK_CHECK_RESULT(
                subAllocatorCallbacks->bindImageFuncPtr(vkTexture->image, vkTexture->allocationId));
        }

        subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.levelCount = This->numLevels;
        subresourceRange.baseArrayLayer = 0;
        subresourceRange.layerCount = numImageLayers;

        // Image barrier to transition, possibly only the base level, image
        // layout to TRANSFER_DST_OPTIMAL so it can be used as the copy
        // destination.
        setImageLayout(
            vdi->vkFuncs,
            vdi->cmdBuffer,
            vkTexture->image,
            VK_IMAGE_LAYOUT_UNDEFINED,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            subresourceRange);

        // Copy mip levels from staging buffer
        vdi->vkFuncs.vkCmdCopyBufferToImage(
            vdi->cmdBuffer, stagingBuffer,
            vkTexture->image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            numCopyRegions, copyRegions
            );

        free(copyRegions);

        if (This->generateMipmaps) {
            generateMipmaps(vkTexture, vdi,
                            blitFilter, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
        } else {
            // Transition image layout to finalLayout after all mip levels
            // have been copied.
            // In this case numImageLevels == This->numLevels
            //subresourceRange.levelCount = numImageLevels;
            setImageLayout(
                vdi->vkFuncs,
                vdi->cmdBuffer,
                vkTexture->image,
                VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                finalLayout,
                subresourceRange);
        }

        // Submit command buffer containing copy and image layout commands
        VK_CHECK_RESULT(
                vdi->vkFuncs.vkEndCommandBuffer(vdi->cmdBuffer));

        // Create a fence to make sure that the copies have finished before
        // continuing
        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateFence(vdi->device, &fenceCreateInfo,
                                      vdi->pAllocator, &copyFence));

        submitInfo.commandBufferCount = 1;
        submitInfo.pCommandBuffers = &vdi->cmdBuffer;

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkQueueSubmit(vdi->queue, 1, &submitInfo, copyFence));

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkWaitForFences(vdi->device, 1, &copyFence,
                                        VK_TRUE, DEFAULT_FENCE_TIMEOUT));

        vdi->vkFuncs.vkDestroyFence(vdi->device, copyFence, vdi->pAllocator);

        // Clean up staging resources
        if (!useSuballocator)
            vdi->vkFuncs.vkFreeMemory(vdi->device, stagingMemory, vdi->pAllocator);
        else
            subAllocatorCallbacks->freeMemFuncPtr(stagingAllocId);
        vdi->vkFuncs.vkDestroyBuffer(vdi->device, stagingBuffer, vdi->pAllocator);
    }
    else
    {
        VkImage mappableImage;
        VkDeviceMemory mappableMemory = VK_NULL_HANDLE;
        VkFence nullFence = { VK_NULL_HANDLE };
        VkSubmitInfo submitInfo = {
            .sType = VK_STRUCTURE_TYPE_SUBMIT_INFO,
            .pNext = NULL
        };
        user_cbdata_linear cbData;
        PFNKTXITERCB callback;

        imageCreateInfo.imageType = imageType;
        imageCreateInfo.flags = createFlags;
        imageCreateInfo.format = vkFormat;
        imageCreateInfo.extent.width = vkTexture->width;
        imageCreateInfo.extent.height = vkTexture->height;
        imageCreateInfo.extent.depth = vkTexture->depth;
        // numImageLevels ensures enough levels for generateMipmaps.
        imageCreateInfo.mipLevels = numImageLevels;
        imageCreateInfo.arrayLayers = numImageLayers;
        imageCreateInfo.samples = VK_SAMPLE_COUNT_1_BIT;
        imageCreateInfo.tiling = VK_IMAGE_TILING_LINEAR;
        imageCreateInfo.usage = usageFlags;
        imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        imageCreateInfo.initialLayout = VK_IMAGE_LAYOUT_PREINITIALIZED;

        // Load mip map level 0 to linear tiling image
        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateImage(vdi->device, &imageCreateInfo,
                                      vdi->pAllocator, &mappableImage));

        // Get memory requirements for this image
        // like size and alignment
        vdi->vkFuncs.vkGetImageMemoryRequirements(vdi->device, mappableImage, &memReqs);
        // Set memory allocation size to required memory size
        memAllocInfo.allocationSize = memReqs.size;

        // Get memory type that can be mapped to host memory
        memAllocInfo.memoryTypeIndex = ktxVulkanDeviceInfo_getMemoryType(
                vdi,
                memReqs.memoryTypeBits,
                VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT);

        // Allocate host memory
        if (!useSuballocator) {
            vResult = vdi->vkFuncs.vkAllocateMemory(vdi->device, &memAllocInfo, vdi->pAllocator,
                &mappableMemory);
            if (vResult != VK_SUCCESS) {
                return KTX_OUT_OF_MEMORY;
            }
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkBindImageMemory(vdi->device, mappableImage,
                    mappableMemory, 0));
        }
        else {
            uint64_t numPages = 0ull;
            vkTexture->allocationId = subAllocatorCallbacks->allocMemFuncPtr(&memAllocInfo, &memReqs, &numPages);
            if (vkTexture->allocationId == 0ull) {
                return KTX_OUT_OF_MEMORY;
            }
            if (numPages > 1ull) { // Sparse binding of KTX textures is unsupported for the moment
                return KTX_UNSUPPORTED_FEATURE;
            }
            VK_CHECK_RESULT(
                subAllocatorCallbacks->bindImageFuncPtr(mappableImage, vkTexture->allocationId));
        }

        cbData.vkFuncs = vdi->vkFuncs;
        cbData.destImage = mappableImage;
        cbData.device = vdi->device;
        cbData.texture = This;
        callback = canUseFasterPath ?
                         linearTilingCallback : linearTilingPadCallback;

        // Map image memory
        if (!useSuballocator) {
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkMapMemory(vdi->device, mappableMemory, 0,
                    memReqs.size, 0, (void**)&cbData.dest));
        }
        else {
            VK_CHECK_RESULT(
                subAllocatorCallbacks->memoryMapFuncPtr(vkTexture->allocationId, 0ull,
                    &memReqs.size, (void**)&cbData.dest));
        }

        // Iterate over images to copy texture data into mapped image memory.
        if (ktxTexture_isActiveStream(This)) {
            kResult = ktxTexture_IterateLoadLevelFaces(This,
                                                       callback,
                                                       &cbData);
        } else {
            kResult = ktxTexture_IterateLevelFaces(This,
                                                   callback,
                                                   &cbData);
        }
        // XXX Check for possible errors
        if (!useSuballocator)
            vdi->vkFuncs.vkUnmapMemory(vdi->device, mappableMemory);
        else
            subAllocatorCallbacks->memoryUnmapFuncPtr(vkTexture->allocationId, 0ull);

        // Linear tiled images can be directly used as textures.
        vkTexture->image = mappableImage;
        if (!useSuballocator) vkTexture->deviceMemory = mappableMemory;

        if (This->generateMipmaps) {
            generateMipmaps(vkTexture, vdi,
                            blitFilter,
                            VK_IMAGE_LAYOUT_PREINITIALIZED);
        } else {
            VkImageSubresourceRange subresourceRange;
            subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
            subresourceRange.baseMipLevel = 0;
            subresourceRange.levelCount = numImageLevels;
            subresourceRange.baseArrayLayer = 0;
            subresourceRange.layerCount = numImageLayers;

           // Transition image layout to finalLayout.
            setImageLayout(
                vdi->vkFuncs,
                vdi->cmdBuffer,
                vkTexture->image,
                VK_IMAGE_LAYOUT_PREINITIALIZED,
                finalLayout,
                subresourceRange);
        }

        // Submit command buffer containing image layout commands
        VK_CHECK_RESULT(vdi->vkFuncs.vkEndCommandBuffer(vdi->cmdBuffer));

        submitInfo.waitSemaphoreCount = 0;
        submitInfo.commandBufferCount = 1;
        submitInfo.pCommandBuffers = &vdi->cmdBuffer;

        VK_CHECK_RESULT(vdi->vkFuncs.vkQueueSubmit(vdi->queue, 1, &submitInfo, nullFence));
        VK_CHECK_RESULT(vdi->vkFuncs.vkQueueWaitIdle(vdi->queue));
    }
    return KTX_SUCCESS;
}